

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall wasm::PrintSExpression::visitImportedGlobal(PrintSExpression *this,Global *curr)

{
  char *__s;
  ostream *poVar1;
  size_t sVar2;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  poVar1 = this->o;
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)this->indent);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_50,local_48);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  local_50._0_1_ = 0x28;
  std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_50,1);
  emitImportHeader(this,&curr->super_Importable);
  std::__ostream_insert<char,std::char_traits<char>>(this->o,"(global ",8);
  poVar1 = Name::print((Name *)curr,this->o);
  local_50 = (long *)CONCAT71(local_50._1_7_,0x20);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_50,1);
  emitGlobalType(this,curr);
  poVar1 = this->o;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"))",2);
  __s = this->maybeNewLine;
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
  }
  return;
}

Assistant:

void PrintSExpression::visitImportedGlobal(Global* curr) {
  doIndent(o, indent);
  o << '(';
  emitImportHeader(curr);
  o << "(global ";
  curr->name.print(o) << ' ';
  emitGlobalType(curr);
  o << "))" << maybeNewLine;
}